

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cryptohelper_test.cpp
# Opt level: O0

void __thiscall
test::test_generate_export_import_and_sign::test_method(test_generate_export_import_and_sign *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  pointer pCVar3;
  long lVar4;
  lazy_ostream *prev;
  basic_cstring<const_char> local_f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]> local_e8;
  assertion_result local_c8;
  basic_cstring<const_char> local_b0;
  basic_cstring<const_char> local_a0;
  allocator local_89;
  string local_88 [32];
  string local_68 [8];
  string signature;
  string pk;
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> local_18;
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> crypto;
  test_generate_export_import_and_sign *this_local;
  
  crypto._M_t.
  super___uniq_ptr_impl<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>._M_t.
  super__Tuple_impl<0UL,_license::CryptoHelper_*,_std::default_delete<license::CryptoHelper>_>.
  super__Head_base<0UL,_license::CryptoHelper_*,_false>._M_head_impl =
       (__uniq_ptr_data<license::CryptoHelper,_std::default_delete<license::CryptoHelper>,_true,_true>
        )(__uniq_ptr_data<license::CryptoHelper,_std::default_delete<license::CryptoHelper>,_true,_true>
          )this;
  license::CryptoHelper::getInstance();
  pCVar3 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
           operator->(&local_18);
  (**pCVar3->_vptr_CryptoHelper)();
  pCVar3 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
           operator->(&local_18);
  (*pCVar3->_vptr_CryptoHelper[1])((undefined1 *)((long)&signature.field_2 + 8));
  pCVar3 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
           operator->(&local_18);
  (*pCVar3->_vptr_CryptoHelper[4])(pCVar3,(undefined1 *)((long)&signature.field_2 + 8));
  pCVar3 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
           operator->(&local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"testString",&local_89);
  (*pCVar3->_vptr_CryptoHelper[5])(local_68,pCVar3,local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/cryptohelper_test.cpp"
               ,0x8c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_a0,0x71,&local_b0);
    lVar4 = std::__cxx11::string::size();
    boost::test_tools::assertion_result::assertion_result(&local_c8,lVar4 == 0xac);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e8,prev,(char (*) [28])"signature is the right size");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/cryptohelper_test.cpp"
               ,0x8c);
    boost::test_tools::tt_detail::report_assertion(&local_c8,&local_e8,&local_f8,0x71,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]>::
    ~lazy_ostream_impl(&local_e8);
    boost::test_tools::assertion_result::~assertion_result(&local_c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::release
            (&local_18);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)(signature.field_2._M_local_buf + 8));
  std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::~unique_ptr
            (&local_18);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_generate_export_import_and_sign) {
	unique_ptr<CryptoHelper> crypto(CryptoHelper::getInstance());
	crypto->generateKeyPair();
	const string pk = crypto->exportPrivateKey();
	crypto->loadPrivateKey(pk);
	const string signature = crypto->signString("testString");
	//(1024/8)*(4/3)+4 (base64)
	BOOST_CHECK_MESSAGE(signature.size() == 172, "signature is the right size");
	crypto.release();
}